

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O3

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint *__ptr;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint local_3c;
  
  __ptr = (uint *)calloc(1,0xc88);
  if (0 < vi->channels) {
    pvVar1 = vi->codec_setup;
    lVar4 = oggpack_read(opb,1);
    if (-1 < (int)lVar4) {
      if ((int)lVar4 == 0) {
        *__ptr = 1;
        local_3c = 1;
      }
      else {
        lVar4 = oggpack_read(opb,4);
        local_3c = (uint)lVar4 + 1;
        *__ptr = local_3c;
        if (0x7ffffffe < (uint)lVar4) goto LAB_001e2cb0;
      }
      lVar4 = oggpack_read(opb,1);
      if ((int)lVar4 < 0) goto LAB_001e2cb0;
      if ((int)lVar4 != 0) {
        lVar4 = oggpack_read(opb,8);
        uVar6 = (uint)lVar4 + 1;
        __ptr[0x121] = uVar6;
        if (0x7ffffffe < (uint)lVar4) goto LAB_001e2cb0;
        iVar2 = vi->channels;
        lVar4 = 0;
        do {
          iVar2 = ov_ilog(iVar2 - 1);
          lVar5 = oggpack_read(opb,iVar2);
          uVar7 = (uint)lVar5;
          __ptr[lVar4 + 0x122] = uVar7;
          iVar2 = ov_ilog(vi->channels - 1);
          lVar5 = oggpack_read(opb,iVar2);
          uVar3 = (uint)lVar5;
          __ptr[lVar4 + 0x222] = uVar3;
          if (((((int)uVar7 < 0) || ((int)uVar3 < 0)) || (uVar7 == uVar3)) ||
             ((iVar2 = vi->channels, iVar2 <= (int)uVar7 || (iVar2 <= (int)uVar3))))
          goto LAB_001e2cb0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)uVar6);
      }
      lVar4 = oggpack_read(opb,2);
      if (lVar4 != 0) goto LAB_001e2cb0;
      if ((int)local_3c < 2) {
LAB_001e2d01:
        if ((int)local_3c < 1) {
          return __ptr;
        }
      }
      else if (0 < vi->channels) {
        lVar4 = 0;
        do {
          lVar5 = oggpack_read(opb,4);
          __ptr[lVar4 + 1] = (uint)lVar5;
          if (local_3c <= (uint)lVar5) goto LAB_001e2cb0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < vi->channels);
        goto LAB_001e2d01;
      }
      uVar8 = 0;
      while( true ) {
        oggpack_read(opb,8);
        lVar4 = oggpack_read(opb,8);
        uVar6 = (uint)lVar4;
        __ptr[uVar8 + 0x101] = uVar6;
        if (((int)uVar6 < 0) || (*(int *)((long)pvVar1 + 0x18) <= (int)uVar6)) break;
        lVar4 = oggpack_read(opb,8);
        uVar6 = (uint)lVar4;
        __ptr[uVar8 + 0x111] = uVar6;
        if (((int)uVar6 < 0) || (*(int *)((long)pvVar1 + 0x1c) <= (int)uVar6)) break;
        uVar8 = uVar8 + 1;
        if (local_3c == uVar8) {
          return __ptr;
        }
      }
      goto LAB_001e2cb0;
    }
  }
  if (__ptr == (uint *)0x0) {
    return (vorbis_info_mapping *)0x0;
  }
LAB_001e2cb0:
  free(__ptr);
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i,b;
  vorbis_info_mapping0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;
  if(vi->channels<=0)goto err_out;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->submaps=oggpack_read(opb,4)+1;
    if(info->submaps<=0)goto err_out;
  }else
    info->submaps=1;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->coupling_steps=oggpack_read(opb,8)+1;
    if(info->coupling_steps<=0)goto err_out;
    for(i=0;i<info->coupling_steps;i++){
      /* vi->channels > 0 is enforced in the caller */
      int testM=info->coupling_mag[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));
      int testA=info->coupling_ang[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));

      if(testM<0 ||
         testA<0 ||
         testM==testA ||
         testM>=vi->channels ||
         testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)!=0)goto err_out; /* 2,3:reserved */

  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps || info->chmuxlist[i]<0)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    oggpack_read(opb,8); /* time submap unused */
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors || info->floorsubmap[i]<0)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues || info->residuesubmap[i]<0)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}